

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>
::Iterator<Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
          (Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed,AbstractingUnifier *args,
          AbstractionOracle args_1,bool args_2)

{
  TypedTermList query_00;
  SortId in_RCX;
  AbstractingUnifier *in_RSI;
  long in_RDI;
  AbstractingUnifier *this_00;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  AbstractingUnifier *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  Node *in_stack_ffffffffffffff70;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> in_stack_ffffffffffffff78;
  Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
  *in_stack_ffffffffffffff80;
  AbstractionOracle in_stack_ffffffffffffff8c;
  TermList in_stack_ffffffffffffff90;
  AbstractingUnifier *in_stack_ffffffffffffffb8;
  
  RetrievalAlgorithms::
  UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
  ::UnificationWithAbstraction
            ((UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>
              *)0x3cbf35);
  Lib::Stack<unsigned_int>::Stack
            ((Stack<unsigned_int> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Lib::Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_>::Option
            ((Option<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>_> *)0x3cbf64);
  Lib::
  Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
  ::Stack((Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>_>
           *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Lib::BacktrackData::BacktrackData((BacktrackData *)(in_RDI + 0x90));
  Lib::Stack<Lib::BacktrackData>::Stack
            ((Stack<Lib::BacktrackData> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  Lib::BacktrackData::BacktrackData((BacktrackData *)(in_RDI + 0xc0));
  InstanceCntr::InstanceCntr((InstanceCntr *)(in_RDI + 200));
  Kernel::AbstractingUnifier::AbstractingUnifier(in_RSI,in_stack_fffffffffffffef8);
  this_00 = (AbstractingUnifier *)&stack0xffffffffffffff68;
  query_00._sort._content = in_RCX._content;
  query_00.super_TermList._content = in_stack_ffffffffffffff90._content;
  init<Kernel::TypedTermList,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
            (in_stack_ffffffffffffff80,
             (SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *)
             in_stack_ffffffffffffff78._M_head_impl,in_stack_ffffffffffffff70,query_00,
             (bool)in_stack_ffffffffffffff6f,(bool)in_stack_ffffffffffffff6e,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffff8c,(bool)in_stack_ffffffffffffff6d);
  Kernel::AbstractingUnifier::~AbstractingUnifier(this_00);
  return;
}

Assistant:

Iterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed, AlgoArgs... args)
       : _algo()
      { init(parent, root, query, retrieveSubstitution, reversed, std::move(args)...); }